

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
index_key_value<jsoncons::json_object_arg_t_const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,key_type *Name,int64_t Index,json_object_arg_t *args,semantic_tag *args_1)

{
  undefined1 uVar1;
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  undefined1 *in_R8;
  allocator<char> local_2a [2];
  undefined1 *local_28;
  undefined8 local_18;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = local_18;
  uVar1 = *local_28;
  std::allocator<char>::allocator();
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(in_RDI + 0x28),
             uVar1,local_2a);
  std::allocator<char>::~allocator(local_2a);
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }